

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclLoad.c
# Opt level: O0

void Abc_SclUpdateLoad(SC_Man *p,Abc_Obj_t *pObj,SC_Cell *pOld,SC_Cell *pNew)

{
  int iVar1;
  Abc_Obj_t *pObj_00;
  SC_Pair *pSVar2;
  SC_Pin *pSVar3;
  SC_Pin *pSVar4;
  SC_Pin *pPinNew;
  SC_Pin *pPinOld;
  SC_Pair *pLoad;
  int k;
  Abc_Obj_t *pFanin;
  SC_Cell *pNew_local;
  SC_Cell *pOld_local;
  Abc_Obj_t *pObj_local;
  SC_Man *p_local;
  
  for (pLoad._4_4_ = 0; iVar1 = Abc_ObjFaninNum(pObj), pLoad._4_4_ < iVar1;
      pLoad._4_4_ = pLoad._4_4_ + 1) {
    pObj_00 = Abc_ObjFanin(pObj,pLoad._4_4_);
    pSVar2 = Abc_SclObjLoad(p,pObj_00);
    pSVar3 = SC_CellPin(pOld,pLoad._4_4_);
    pSVar4 = SC_CellPin(pNew,pLoad._4_4_);
    pSVar2->rise = (pSVar4->rise_cap - pSVar3->rise_cap) + pSVar2->rise;
    pSVar2->fall = (pSVar4->fall_cap - pSVar3->fall_cap) + pSVar2->fall;
  }
  return;
}

Assistant:

void Abc_SclUpdateLoad( SC_Man * p, Abc_Obj_t * pObj, SC_Cell * pOld, SC_Cell * pNew )
{
    Abc_Obj_t * pFanin;
    int k;
    Abc_ObjForEachFanin( pObj, pFanin, k )
    {
        SC_Pair * pLoad = Abc_SclObjLoad( p, pFanin );
        SC_Pin * pPinOld = SC_CellPin( pOld, k );
        SC_Pin * pPinNew = SC_CellPin( pNew, k );
        pLoad->rise += pPinNew->rise_cap - pPinOld->rise_cap;
        pLoad->fall += pPinNew->fall_cap - pPinOld->fall_cap;
    }
}